

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O3

int fits_rdecomp(uchar *c,int clen,uint *array,int nx,int nblock)

{
  byte bVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  char *err_message;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  auVar5 = _DAT_0021b130;
  auVar4 = _DAT_0020b9d0;
  auVar3 = _DAT_0020b9c0;
  iVar8 = 1;
  if (clen < 4) {
    err_message = "decompression error: input buffer not properly allocated";
  }
  else {
    uVar15 = *(uint *)c;
    uVar17 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18;
    uVar16 = (uint)c[4];
    pbVar11 = c + 5;
    iVar8 = 0;
    uVar15 = 8;
    do {
      if (nx <= iVar8) {
        iVar8 = 0;
        if (c + (uint)clen <= pbVar11) {
          return 0;
        }
        err_message = "decompression warning: unused bytes at end of compressed buffer";
        goto LAB_001ff478;
      }
      if ((int)uVar15 < 5) {
        uVar14 = uVar15 - 0xd;
        do {
          uVar15 = uVar14;
          bVar6 = *pbVar11;
          pbVar11 = pbVar11 + 1;
          uVar16 = (uint)bVar6 | uVar16 << 8;
          uVar14 = uVar15 + 8;
        } while (uVar14 < 0xfffffff8);
        uVar15 = uVar15 + 0x10;
      }
      else {
        uVar15 = uVar15 - 5;
      }
      bVar6 = (byte)uVar15;
      uVar14 = uVar16 >> (bVar6 & 0x1f);
      uVar10 = ~(-1 << (bVar6 & 0x1f));
      uVar16 = uVar16 & uVar10;
      iVar18 = iVar8 + nblock;
      if (nx <= iVar8 + nblock) {
        iVar18 = nx;
      }
      iVar9 = uVar14 - 1;
      if (iVar9 < 0) {
        if (iVar8 < iVar18) {
          lVar19 = (long)iVar8;
          lVar12 = (iVar18 - lVar19) + -1;
          auVar20._8_4_ = (int)lVar12;
          auVar20._0_8_ = lVar12;
          auVar20._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar20 = auVar20 ^ auVar4;
          uVar13 = 0;
          do {
            auVar21._8_4_ = (int)uVar13;
            auVar21._0_8_ = uVar13;
            auVar21._12_4_ = (int)(uVar13 >> 0x20);
            auVar22 = (auVar21 | auVar3) ^ auVar4;
            iVar8 = auVar20._4_4_;
            if ((bool)(~(iVar8 < auVar22._4_4_ ||
                        auVar20._0_4_ < auVar22._0_4_ && auVar22._4_4_ == iVar8) & 1)) {
              array[lVar19 + uVar13] = uVar17;
            }
            if (auVar22._12_4_ <= auVar20._12_4_ &&
                (auVar22._8_4_ <= auVar20._8_4_ || auVar22._12_4_ != auVar20._12_4_)) {
              array[lVar19 + uVar13 + 1] = uVar17;
            }
            auVar21 = (auVar21 | auVar5) ^ auVar4;
            iVar9 = auVar21._4_4_;
            if (iVar9 <= iVar8 && (iVar9 != iVar8 || auVar21._0_4_ <= auVar20._0_4_)) {
              array[lVar19 + uVar13 + 2] = uVar17;
              array[lVar19 + uVar13 + 3] = uVar17;
            }
            uVar13 = uVar13 + 4;
            iVar8 = iVar18;
          } while (((iVar18 - lVar19) + 3U & 0xfffffffffffffffc) != uVar13);
        }
      }
      else if (iVar9 == 0x19) {
        if (iVar8 < iVar18) {
          lVar19 = (long)iVar8;
          do {
            uVar14 = uVar16 << ((byte)(0x20 - uVar15) & 0x1f);
            iVar8 = 0x20 - uVar15;
            cVar7 = '\x18' - bVar6;
            if (uVar15 < 0x19) {
              do {
                iVar9 = iVar8;
                iVar8 = iVar9 + -8;
                bVar1 = *pbVar11;
                bVar2 = (byte)iVar8 & 0x1f;
                pbVar11 = pbVar11 + 1;
                uVar14 = uVar14 | (uint)bVar1 << bVar2;
              } while (7 < iVar8);
              if (uVar15 != 0) {
                cVar7 = (char)iVar9 + -0x10;
                goto LAB_001ff28a;
              }
              uVar16 = 0 << bVar2;
            }
            else {
LAB_001ff28a:
              bVar1 = *pbVar11;
              pbVar11 = pbVar11 + 1;
              uVar14 = uVar14 | bVar1 >> (-cVar7 & 0x1fU);
              uVar16 = bVar1 & uVar10;
            }
            uVar17 = uVar17 + (-(uVar14 & 1) ^ uVar14 >> 1);
            array[lVar19] = uVar17;
            lVar19 = lVar19 + 1;
            iVar8 = iVar18;
          } while (lVar19 != iVar18);
        }
      }
      else if (iVar8 < iVar18) {
        lVar19 = (long)iVar8;
        do {
          while (uVar16 == 0) {
            uVar15 = uVar15 + 8;
            bVar6 = *pbVar11;
            pbVar11 = pbVar11 + 1;
            uVar16 = (uint)bVar6;
          }
          uVar14 = uVar15 - nonzero_count[uVar16];
          uVar15 = uVar15 + ~uVar14;
          uVar16 = uVar16 ^ 1 << (uVar15 & 0x1f);
          uVar15 = uVar15 - iVar9;
          if ((int)uVar15 < 0) {
            do {
              bVar6 = *pbVar11;
              pbVar11 = pbVar11 + 1;
              uVar16 = uVar16 << 8 | (uint)bVar6;
              uVar15 = uVar15 + 8;
            } while (7 < uVar15);
          }
          uVar14 = uVar16 >> ((byte)uVar15 & 0x1f) | uVar14 << ((byte)iVar9 & 0x1f);
          uVar16 = ~(-1 << ((byte)uVar15 & 0x1f)) & uVar16;
          uVar17 = uVar17 + (-(uVar14 & 1) ^ uVar14 >> 1);
          array[lVar19] = uVar17;
          lVar19 = lVar19 + 1;
          iVar8 = iVar18;
        } while (lVar19 != iVar18);
      }
    } while (pbVar11 <= c + (uint)clen);
    iVar8 = 1;
    err_message = "decompression error: hit end of compressed byte stream";
  }
LAB_001ff478:
  ffpmsg(err_message);
  return iVar8;
}

Assistant:

int fits_rdecomp (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned int array[],	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
/* int bsize;  */
int i, k, imax;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 4; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 5;
    fsmax = 25;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 4 bytes of input buffer contain the value of the first */
    /* 4 byte integer value, without any encoding */
    
    if (clen < 4)
    {
       ffpmsg("decompression error: input buffer not properly allocated");
       return 1;
    }
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<24);
    bytevalue = c[1];
    lastpix = lastpix | (bytevalue<<16);
    bytevalue = c[2];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[3];
    lastpix = lastpix | bytevalue;

    c += 4;  
    cend = c + clen - 4;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}